

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

void Ssw_SmlSimulateOne(Ssw_Sml_t *p)

{
  int iVar1;
  abctime aVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pIn;
  abctime aVar4;
  int iFrame;
  Aig_Man_t *p_00;
  int iVar5;
  
  aVar2 = Abc_Clock();
  for (iFrame = 0; iFrame < p->nFrames; iFrame = iFrame + 1) {
    iVar5 = 0;
    while( true ) {
      p_00 = p->pAig;
      if (p_00->vObjs->nSize <= iVar5) break;
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_00->vObjs,iVar5);
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
        Ssw_SmlNodeSimulate(p,pAVar3,iFrame);
      }
      iVar5 = iVar5 + 1;
    }
    for (iVar5 = 0; iVar5 < p_00->nTruePos; iVar5 = iVar5 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_00->vCos,iVar5);
      Ssw_SmlNodeCopyFanin(p,pAVar3,iFrame);
      p_00 = p->pAig;
    }
    for (iVar5 = 0; iVar1 = p_00->nRegs, iVar5 < iVar1; iVar5 = iVar5 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_00->vCos,p_00->nTruePos + iVar5);
      Ssw_SmlNodeCopyFanin(p,pAVar3,iFrame);
      p_00 = p->pAig;
    }
    if (iFrame == p->nFrames + -1) break;
    for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
      pAVar3 = Saig_ManLi(p_00,iVar5);
      pIn = Saig_ManLo(p->pAig,iVar5);
      Ssw_SmlNodeTransferNext(p,pAVar3,pIn,iFrame);
      p_00 = p->pAig;
      iVar1 = p_00->nRegs;
    }
  }
  aVar4 = Abc_Clock();
  p->timeSim = p->timeSim + (aVar4 - aVar2);
  p->nSimRounds = p->nSimRounds + 1;
  return;
}

Assistant:

void Ssw_SmlSimulateOne( Ssw_Sml_t * p )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int f, i;
    abctime clk;
clk = Abc_Clock();
    for ( f = 0; f < p->nFrames; f++ )
    {
        // simulate the nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
            Ssw_SmlNodeSimulate( p, pObj, f );
        // copy simulation info into outputs
        Saig_ManForEachPo( p->pAig, pObj, i )
            Ssw_SmlNodeCopyFanin( p, pObj, f );
        // copy simulation info into outputs
        Saig_ManForEachLi( p->pAig, pObj, i )
            Ssw_SmlNodeCopyFanin( p, pObj, f );
        // quit if this is the last timeframe
        if ( f == p->nFrames - 1 )
            break;
        // copy simulation info into the inputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
            Ssw_SmlNodeTransferNext( p, pObjLi, pObjLo, f );
    }
p->timeSim += Abc_Clock() - clk;
p->nSimRounds++;
}